

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

void __thiscall
chrono::robosimian::RS_Driver::LoadDataLine(RS_Driver *this,double *time,Actuation *activations)

{
  long lVar1;
  int i;
  long lVar2;
  
  std::istream::_M_extract<double>((double *)this->m_ifs);
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 8) {
      std::istream::_M_extract<double>((double *)this->m_ifs);
    }
  }
  return;
}

Assistant:

void RS_Driver::LoadDataLine(double& time, Actuation& activations) {
    *m_ifs >> time;
    for (int i = 0; i < 4; i++) {
        for (int j = 0; j < 8; j++) {
            *m_ifs >> activations[i][j];
        }
    }
}